

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcdctmgr.c
# Opt level: O0

void forward_DCT(j_compress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY sample_data,
                JBLOCKROW coef_blocks,JDIMENSION start_row,JDIMENSION start_col,
                JDIMENSION num_blocks)

{
  long lVar1;
  undefined8 uVar2;
  code *pcVar3;
  code *pcVar4;
  code *pcVar5;
  undefined8 uVar6;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  int in_R9D;
  quantize_method_ptr do_quantize;
  convsamp_method_ptr do_convsamp;
  forward_DCT_method_ptr do_dct;
  JDIMENSION bi;
  DCTELEM *workspace;
  DCTELEM *divisors;
  my_fdct_ptr fdct;
  undefined4 local_44;
  undefined4 local_28;
  
  lVar1 = *(long *)(in_RDI + 0x1e8);
  uVar2 = *(undefined8 *)(lVar1 + 0x28 + (long)*(int *)(in_RSI + 0x10) * 8);
  pcVar3 = *(code **)(lVar1 + 0x10);
  pcVar4 = *(code **)(lVar1 + 0x18);
  pcVar5 = *(code **)(lVar1 + 0x20);
  uVar6 = *(undefined8 *)(lVar1 + 0x48);
  local_28 = in_R9D;
  for (local_44 = 0; local_44 < (uint)do_quantize; local_44 = local_44 + 1) {
    (*pcVar4)(in_RDX + (ulong)in_R8D * 8,local_28,uVar6);
    (*pcVar3)(uVar6);
    (*pcVar5)(in_RCX + (ulong)local_44 * 0x80,uVar2,uVar6);
    local_28 = local_28 + 8;
  }
  return;
}

Assistant:

METHODDEF(void)
forward_DCT(j_compress_ptr cinfo, jpeg_component_info *compptr,
            JSAMPARRAY sample_data, JBLOCKROW coef_blocks,
            JDIMENSION start_row, JDIMENSION start_col, JDIMENSION num_blocks)
/* This version is used for integer DCT implementations. */
{
  /* This routine is heavily used, so it's worth coding it tightly. */
  my_fdct_ptr fdct = (my_fdct_ptr)cinfo->fdct;
  DCTELEM *divisors = fdct->divisors[compptr->quant_tbl_no];
  DCTELEM *workspace;
  JDIMENSION bi;

  /* Make sure the compiler doesn't look up these every pass */
  forward_DCT_method_ptr do_dct = fdct->dct;
  convsamp_method_ptr do_convsamp = fdct->convsamp;
  quantize_method_ptr do_quantize = fdct->quantize;
  workspace = fdct->workspace;

  sample_data += start_row;     /* fold in the vertical offset once */

  for (bi = 0; bi < num_blocks; bi++, start_col += DCTSIZE) {
    /* Load data into workspace, applying unsigned->signed conversion */
    (*do_convsamp) (sample_data, start_col, workspace);

    /* Perform the DCT */
    (*do_dct) (workspace);

    /* Quantize/descale the coefficients, and store into coef_blocks[] */
    (*do_quantize) (coef_blocks[bi], divisors, workspace);
  }
}